

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  second_type pFVar1;
  CppType CVar2;
  int iVar3;
  uint uVar4;
  Type TVar5;
  LogMessage *pLVar6;
  second_type *ppFVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  undefined4 extraout_var_01;
  string *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  FieldDescriptor *field_local;
  TextGenerator *local_d0;
  LogMessage local_c8;
  string scratch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string truncated_value;
  Message *message_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  field_local = field;
  local_d0 = generator;
  if ((index != -1) && (*(int *)(field + 0x4c) != 3)) {
    internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x6d0);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)&scratch,pLVar6);
    internal::LogMessage::~LogMessage(&local_c8);
  }
  local_c8._0_8_ = (this->default_field_value_printer_).ptr_;
  ppFVar7 = FindWithDefault<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
                      (&this->custom_printers_,&field_local,(second_type *)&local_c8);
  pFVar1 = *ppFVar7;
  CVar2 = FieldDescriptor::cpp_type(field_local);
  switch(CVar2) {
  case CPPTYPE_INT32:
    if (*(int *)(field_local + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x2a])();
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x11])(reflection,message);
    }
    (*pFVar1->_vptr_FieldValuePrinter[3])(&local_c8,pFVar1,(ulong)uVar4);
    TextGenerator::Print(local_d0,(string *)&local_c8);
    break;
  case CPPTYPE_INT64:
    if (*(int *)(field_local + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x2b])();
      uVar8 = CONCAT44(extraout_var_01,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message);
      uVar8 = CONCAT44(extraout_var_05,iVar3);
    }
    (*pFVar1->_vptr_FieldValuePrinter[5])(&local_c8,pFVar1,uVar8);
    TextGenerator::Print(local_d0,(string *)&local_c8);
    break;
  case CPPTYPE_UINT32:
    if (*(int *)(field_local + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x2c])();
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x13])(reflection,message);
    }
    (*pFVar1->_vptr_FieldValuePrinter[4])(&local_c8,pFVar1,(ulong)uVar4);
    TextGenerator::Print(local_d0,(string *)&local_c8);
    break;
  case CPPTYPE_UINT64:
    if (*(int *)(field_local + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x2d])();
      uVar8 = CONCAT44(extraout_var_00,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x14])(reflection,message);
      uVar8 = CONCAT44(extraout_var_04,iVar3);
    }
    (*pFVar1->_vptr_FieldValuePrinter[6])(&local_c8,pFVar1,uVar8);
    TextGenerator::Print(local_d0,(string *)&local_c8);
    break;
  case CPPTYPE_DOUBLE:
    if (*(int *)(field_local + 0x4c) == 3) {
      (*reflection->_vptr_Reflection[0x2f])();
    }
    else {
      (*reflection->_vptr_Reflection[0x16])(reflection,message);
    }
    (*pFVar1->_vptr_FieldValuePrinter[8])(&local_c8,pFVar1);
    TextGenerator::Print(local_d0,(string *)&local_c8);
    break;
  case CPPTYPE_FLOAT:
    if (*(int *)(field_local + 0x4c) == 3) {
      (*reflection->_vptr_Reflection[0x2e])();
    }
    else {
      (*reflection->_vptr_Reflection[0x15])(reflection,message);
    }
    (*pFVar1->_vptr_FieldValuePrinter[7])(&local_c8,pFVar1);
    TextGenerator::Print(local_d0,(string *)&local_c8);
    break;
  case CPPTYPE_BOOL:
    if (*(int *)(field_local + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x30])();
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x17])(reflection,message);
    }
    (*pFVar1->_vptr_FieldValuePrinter[2])(&local_c8,pFVar1,(ulong)(uVar4 & 0xff));
    TextGenerator::Print(local_d0,(string *)&local_c8);
    break;
  case CPPTYPE_ENUM:
    if (*(int *)(field_local + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x33])();
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x1a])(reflection,message);
    }
    this_01 = FieldDescriptor::enum_type(field_local);
    pEVar9 = EnumDescriptor::FindValueByNumber(this_01,uVar4);
    if (pEVar9 == (EnumValueDescriptor *)0x0) {
      StringPrintf_abi_cxx11_(&scratch,"%d",(ulong)uVar4);
      (*pFVar1->_vptr_FieldValuePrinter[0xb])(&local_c8,pFVar1,(ulong)uVar4,&scratch);
      TextGenerator::Print(local_d0,(string *)&local_c8);
      pLVar6 = &local_c8;
      goto LAB_0032cd09;
    }
    (*pFVar1->_vptr_FieldValuePrinter[0xb])(&local_c8,pFVar1,(ulong)uVar4,*(undefined8 *)pEVar9);
    TextGenerator::Print(local_d0,(string *)&local_c8);
    break;
  case CPPTYPE_STRING:
    scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
    scratch._M_string_length = 0;
    scratch.field_2._M_local_buf[0] = '\0';
    if (*(int *)(field_local + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x35])(reflection,message,field_local,index,&scratch);
      this_00 = (string *)CONCAT44(extraout_var_02,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field_local,&scratch);
      this_00 = (string *)CONCAT44(extraout_var_06,iVar3);
    }
    truncated_value._M_dataplus._M_p = (pointer)&truncated_value.field_2;
    truncated_value._M_string_length = 0;
    truncated_value.field_2._M_local_buf[0] = '\0';
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                     &local_70,"...<truncated>...");
      this_00 = &truncated_value;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_70);
    }
    TVar5 = FieldDescriptor::type(field_local);
    if (TVar5 == TYPE_STRING) {
      (*pFVar1->_vptr_FieldValuePrinter[9])(&local_c8,pFVar1,this_00);
      TextGenerator::Print(local_d0,(string *)&local_c8);
    }
    else {
      TVar5 = FieldDescriptor::type(field_local);
      if (TVar5 != TYPE_BYTES) {
        internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x6f9);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_c8,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar6);
        internal::LogMessage::~LogMessage(&local_c8);
      }
      (*pFVar1->_vptr_FieldValuePrinter[10])(&local_c8,pFVar1,this_00);
      TextGenerator::Print(local_d0,(string *)&local_c8);
    }
    std::__cxx11::string::~string((string *)&local_c8);
    pLVar6 = (LogMessage *)&truncated_value;
LAB_0032cd09:
    std::__cxx11::string::~string((string *)pLVar6);
    pLVar6 = (LogMessage *)&scratch;
    goto LAB_0032cb7a;
  case CPPTYPE_MESSAGE:
    if (*(int *)(field_local + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x34])();
      message_00 = (Message *)CONCAT44(extraout_var,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field_local,0);
      message_00 = (Message *)CONCAT44(extraout_var_03,iVar3);
    }
    Print(this,message_00,local_d0);
  default:
    goto switchD_0032c864_default;
  }
  pLVar6 = &local_c8;
LAB_0032cb7a:
  std::__cxx11::string::~string((string *)pLVar6);
switchD_0032c864_default:
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(
    const Message& message,
    const Reflection* reflection,
    const FieldDescriptor* field,
    int index,
    TextGenerator& generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FieldValuePrinter* printer
      = FindWithDefault(custom_printers_, field,
                        default_field_value_printer_.get());

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                   \
    case FieldDescriptor::CPPTYPE_##CPPTYPE:                            \
      generator.Print(printer->Print##METHOD(field->is_repeated()       \
               ? reflection->GetRepeated##METHOD(message, field, index) \
               : reflection->Get##METHOD(message, field)));             \
        break

    OUTPUT_FIELD( INT32,  Int32);
    OUTPUT_FIELD( INT64,  Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD( FLOAT,  Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(  BOOL,   Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      string scratch;
      const string& value = field->is_repeated()
          ? reflection->GetRepeatedStringReference(
              message, field, index, &scratch)
          : reflection->GetStringReference(message, field, &scratch);
      const string* value_to_print = &value;
      string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        generator.Print(printer->PrintString(*value_to_print));
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        generator.Print(printer->PrintBytes(*value_to_print));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value = field->is_repeated()
          ? reflection->GetRepeatedEnumValue(message, field, index)
          : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != NULL) {
        generator.Print(printer->PrintEnum(enum_value, enum_desc->name()));
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        generator.Print(printer->PrintEnum(enum_value,
                                           StringPrintf("%d", enum_value)));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
            ? reflection->GetRepeatedMessage(message, field, index)
            : reflection->GetMessage(message, field),
            generator);
      break;
  }
}